

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTileDescriptionAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>::writeValueTo
          (TypedAttribute<Imf_3_4::TileDescription> *this,OStream *os,int version)

{
  byte local_19;
  uint local_18;
  uint local_14;
  
  local_18 = (this->_value).xSize;
  (*os->_vptr_OStream[2])(os,&local_18,4);
  local_14 = (this->_value).ySize;
  (*os->_vptr_OStream[2])(os,&local_14,4);
  local_19 = (byte)((this->_value).roundingMode << 4) | (byte)(this->_value).mode;
  (*os->_vptr_OStream[2])(os,&local_19,1);
  return;
}

Assistant:

IMF_EXPORT void
TileDescriptionAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.xSize);
    Xdr::write<StreamIO> (os, _value.ySize);

    unsigned char tmp = _value.mode | (_value.roundingMode << 4);
    Xdr::write<StreamIO> (os, tmp);
}